

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Integrate.cpp
# Opt level: O2

double __thiscall chrono::ChFunction_Integrate::Get_y(ChFunction_Integrate *this,double x)

{
  double dVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  CoeffReturnType pdVar4;
  Index index;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  dVar1 = this->x_start;
  dVar5 = 0.0;
  if ((dVar1 <= x) && (x <= this->x_end)) {
    index = (long)this->num_samples + -1;
    dVar1 = ((x - dVar1) / (this->x_end - dVar1)) * (double)(int)index;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar1;
    auVar6 = vroundsd_avx(auVar6,auVar6,9);
    uVar3 = (uint)auVar6._0_8_;
    if ((int)uVar3 < (int)index) {
      if (-1 < (int)uVar3) {
        dVar1 = dVar1 - (double)(int)uVar3;
        pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)
                            &this->array_x,(ulong)uVar3);
        dVar5 = *pdVar4;
        pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)
                            &this->array_x,(ulong)(uVar3 + 1));
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dVar5;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = 1.0 - dVar1;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = dVar1 * *pdVar4;
        auVar6 = vfmadd231sd_fma(auVar7,auVar8,auVar2);
        return auVar6._0_8_;
      }
      index = 0;
    }
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)&this->array_x,
                        index);
    dVar5 = *pdVar4;
  }
  return dVar5;
}

Assistant:

double ChFunction_Integrate::Get_y(double x) const {
    if ((x < x_start) || (x > x_end))
        return 0.0;
    int i_a, i_b;
    double position = (double)(num_samples - 1) * ((x - x_start) / (x_end - x_start));
    i_a = (int)(floor(position));
    i_b = i_a + 1;

    if (i_b > num_samples - 1)
        return array_x(num_samples - 1);

    if (i_a < 0)
        return array_x(0);

    double weightB = position - (double)i_a;
    double weightA = 1 - weightB;

    return (weightA * (array_x(i_a)) + weightB * (array_x(i_b)));
}